

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polygon.c
# Opt level: O0

void polygon_push_triangle_callback(int i0,int i1,int i2,void *user_data)

{
  long lVar1;
  long in_RCX;
  int in_EDX;
  int in_ESI;
  int in_EDI;
  float *v2;
  float *v1;
  float *v0;
  float *vertices;
  ALLEGRO_PRIM_VERTEX_CACHE *cache;
  float *in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_RCX + 0x2428);
  _al_prim_cache_push_triangle
            ((ALLEGRO_PRIM_VERTEX_CACHE *)(lVar1 + (long)(in_EDI << 1) * 4),
             (float *)(lVar1 + (long)(in_ESI << 1) * 4),(float *)(lVar1 + (long)(in_EDX << 1) * 4),
             in_stack_ffffffffffffffb8);
  return;
}

Assistant:

static void polygon_push_triangle_callback(int i0, int i1, int i2, void* user_data)
{
   ALLEGRO_PRIM_VERTEX_CACHE* cache = (ALLEGRO_PRIM_VERTEX_CACHE*)user_data;

   const float* vertices = (const float*)cache->user_data;

   const float* v0 = vertices + (i0 * 2);
   const float* v1 = vertices + (i1 * 2);
   const float* v2 = vertices + (i2 * 2);

   _al_prim_cache_push_triangle(cache, v0, v1, v2);
}